

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O2

uint64 readle64(void)

{
  ssize_t sVar1;
  uint64 retval;
  
  retval = 0;
  if (io_failure == '\0') {
    sVar1 = read(logfd,&retval,8);
    if (sVar1 != 8) {
      IO_READ_FAIL((uint)(-1 < sVar1));
    }
  }
  return retval;
}

Assistant:

static uint64 readle64(void)
{
    uint64 retval = 0;
    if (!io_failure) {
        const ssize_t br = read(logfd, &retval, sizeof (retval));
        if (br != ((ssize_t) sizeof (retval))) {
            IO_READ_FAIL(br >= 0);
        }
    }
    return swap64(retval);
}